

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_parser_test.cpp
# Opt level: O2

void __thiscall
bioparser::test::SamOverlap::SamOverlap
          (SamOverlap *this,char *q_name,uint32_t q_name_len,uint32_t flag,char *t_name,
          uint32_t t_name_len,uint32_t t_begin,uint32_t map_quality,char *cigar,uint32_t cigar_len,
          char *t_next_name,uint32_t t_next_name_len,uint32_t t_next_begin,uint32_t template_len,
          char *data,uint32_t data_len,char *quality,uint32_t quality_len)

{
  biosoup::Overlap::Overlap(&this->super_Overlap,0,0,0,0,t_begin,0,0,cigar,cigar_len,true);
  (this->q_name)._M_dataplus._M_p = (pointer)&(this->q_name).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->q_name,q_name,q_name + q_name_len);
  this->flag = flag;
  (this->t_name)._M_dataplus._M_p = (pointer)&(this->t_name).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->t_name,t_name,t_name + t_name_len);
  this->map_quality = map_quality;
  (this->t_next_name)._M_dataplus._M_p = (pointer)&(this->t_next_name).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->t_next_name,t_next_name,t_next_name + t_next_name_len);
  this->t_next_begin = t_next_begin;
  this->template_len = template_len;
  (this->data)._M_dataplus._M_p = (pointer)&(this->data).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->data,data,data + data_len);
  (this->quality)._M_dataplus._M_p = (pointer)&(this->quality).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->quality,quality,quality + quality_len);
  return;
}

Assistant:

SamOverlap(
      const char* q_name, std::uint32_t q_name_len,
      std::uint32_t flag,
      const char* t_name, std::uint32_t t_name_len,
      std::uint32_t t_begin,
      std::uint32_t map_quality,
      const char* cigar, std::uint32_t cigar_len,
      const char* t_next_name, std::uint32_t t_next_name_len,
      std::uint32_t t_next_begin,
      std::uint32_t template_len,
      const char* data, std::uint32_t data_len,
      const char* quality, std::uint32_t quality_len)
      : biosoup::Overlap(
          0, 0, 0,
          0, t_begin, 0,
          0,
          cigar, cigar_len),
        q_name(q_name, q_name_len),
        flag(flag),
        t_name(t_name, t_name_len),
        map_quality(map_quality),
        t_next_name(t_next_name, t_next_name_len),
        t_next_begin(t_next_begin),
        template_len(template_len),
        data(data, data_len),
        quality(quality, quality_len) {}